

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O1

void __thiscall
Eigen::JacobiRotation<double>::makeGivens
          (JacobiRotation<double> *this,double *p,double *q,double *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = *q;
  dVar1 = *p;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if (ABS(dVar1) <= ABS(dVar3)) {
        dVar1 = dVar1 / dVar3;
        dVar3 = dVar1 * dVar1 + 1.0;
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        dVar2 = (double)(~-(ulong)(*q < 0.0) & (ulong)dVar3 | (ulong)-dVar3 & -(ulong)(*q < 0.0));
        dVar3 = -1.0 / dVar2;
        this->m_s = dVar3;
        this->m_c = -dVar1 * dVar3;
        if (r == (double *)0x0) {
          return;
        }
        dVar2 = dVar2 * *q;
      }
      else {
        dVar3 = dVar3 / dVar1;
        dVar1 = dVar3 * dVar3 + 1.0;
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        dVar2 = (double)(~-(ulong)(*p < 0.0) & (ulong)dVar1 | (ulong)-dVar1 & -(ulong)(*p < 0.0));
        dVar1 = 1.0 / dVar2;
        this->m_c = dVar1;
        this->m_s = -dVar3 * dVar1;
        if (r == (double *)0x0) {
          return;
        }
        dVar2 = dVar2 * *p;
      }
      goto LAB_0012b43b;
    }
    this->m_c = 0.0;
    this->m_s = *(double *)(&DAT_0013a2a0 + (ulong)(*q <= 0.0 && *q != 0.0) * 8);
    if (r == (double *)0x0) {
      return;
    }
    dVar2 = *q;
  }
  else {
    this->m_c = *(double *)(&DAT_0013a2b0 + (ulong)(dVar1 < 0.0) * 8);
    this->m_s = 0.0;
    if (r == (double *)0x0) {
      return;
    }
    dVar2 = *p;
  }
  dVar2 = ABS(dVar2);
LAB_0012b43b:
  *r = dVar2;
  return;
}

Assistant:

void JacobiRotation<Scalar>::makeGivens(const Scalar& p, const Scalar& q, Scalar* r, internal::false_type)
{
  using std::sqrt;
  using std::abs;
  if(q==Scalar(0))
  {
    m_c = p<Scalar(0) ? Scalar(-1) : Scalar(1);
    m_s = Scalar(0);
    if(r) *r = abs(p);
  }
  else if(p==Scalar(0))
  {
    m_c = Scalar(0);
    m_s = q<Scalar(0) ? Scalar(1) : Scalar(-1);
    if(r) *r = abs(q);
  }
  else if(abs(p) > abs(q))
  {
    Scalar t = q/p;
    Scalar u = sqrt(Scalar(1) + numext::abs2(t));
    if(p<Scalar(0))
      u = -u;
    m_c = Scalar(1)/u;
    m_s = -t * m_c;
    if(r) *r = p * u;
  }
  else
  {
    Scalar t = p/q;
    Scalar u = sqrt(Scalar(1) + numext::abs2(t));
    if(q<Scalar(0))
      u = -u;
    m_s = -Scalar(1)/u;
    m_c = -t * m_s;
    if(r) *r = q * u;
  }

}